

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::DetectMapConflicts
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer ppVar4;
  string *__lhs;
  string *__rhs;
  Descriptor *in_RDX;
  DescriptorBuilder *in_RSI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_Descriptor_*>_>::value,_pair<iterator,_bool>_>
  _Var5;
  iterator iter_2;
  OneofDescriptor *oneof_desc;
  int i_3;
  iterator iter_1;
  EnumDescriptor *enum_desc;
  int i_2;
  iterator iter;
  FieldDescriptor *field;
  int i_1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_bool>
  result;
  Descriptor *nested;
  int i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  seen_types;
  Descriptor *in_stack_fffffffffffffc88;
  DescriptorProto *in_stack_fffffffffffffc90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>
  *in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  bool local_349;
  undefined4 in_stack_fffffffffffffcd0;
  int iVar6;
  undefined4 in_stack_fffffffffffffcd4;
  Descriptor *in_stack_fffffffffffffcd8;
  bool local_2f9;
  bool local_2a9;
  string *in_stack_fffffffffffffd60;
  FieldDescriptor *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  int iVar7;
  undefined4 in_stack_fffffffffffffd74;
  DescriptorProto *in_stack_fffffffffffffd78;
  DescriptorBuilder *in_stack_fffffffffffffd80;
  string local_210 [32];
  string local_1f0 [32];
  _Self local_1d0;
  _Self local_1c8;
  OneofDescriptor *local_1c0;
  int local_1b4;
  string local_1b0 [32];
  string local_190 [32];
  _Self local_170;
  _Self local_168;
  EnumDescriptor *local_160;
  int local_154;
  string local_150 [32];
  string local_130 [32];
  _Self local_110;
  _Self local_108;
  FieldDescriptor *local_100;
  int local_f4;
  string local_f0 [32];
  string local_d0 [32];
  _Base_ptr local_b0;
  undefined1 local_a8;
  _Base_ptr local_78;
  byte local_70;
  Descriptor *local_68;
  int local_4c;
  DescriptorProto *in_stack_ffffffffffffffe0;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
         *)0x4c8f8c);
  local_4c = 0;
  do {
    iVar7 = local_4c;
    iVar2 = Descriptor::nested_type_count((Descriptor *)in_RSI);
    if (iVar2 <= iVar7) {
      local_f4 = 0;
      while (iVar7 = local_f4, iVar2 = Descriptor::field_count((Descriptor *)in_RSI), iVar7 < iVar2)
      {
        in_stack_fffffffffffffd68 = Descriptor::field((Descriptor *)in_RSI,local_f4);
        local_100 = in_stack_fffffffffffffd68;
        in_stack_fffffffffffffd60 = FieldDescriptor::name_abi_cxx11_(in_stack_fffffffffffffd68);
        local_108._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
                     *)in_stack_fffffffffffffc88,(key_type *)0x4c9390);
        local_110._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
                    *)in_stack_fffffffffffffc88);
        bVar1 = std::operator!=(&local_108,&local_110);
        local_2a9 = false;
        if (bVar1) {
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                                 *)0x4c93f3);
          Descriptor::options(ppVar4->second);
          local_2a9 = MessageOptions::map_entry((MessageOptions *)0x4c9413);
        }
        if (local_2a9 != false) {
          Descriptor::full_name_abi_cxx11_((Descriptor *)in_RSI);
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                                 *)0x4c9470);
          Descriptor::name_abi_cxx11_(ppVar4->second);
          std::operator+((char *)in_stack_fffffffffffffcd8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          std::operator+(&in_stack_fffffffffffffc98->first,(char *)in_stack_fffffffffffffc90);
          AddError(in_stack_fffffffffffffd80,(string *)in_stack_fffffffffffffd78,
                   (Message *)CONCAT44(iVar2,iVar7),
                   (ErrorLocation)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                   in_stack_fffffffffffffd60);
          std::__cxx11::string::~string(local_130);
          std::__cxx11::string::~string(local_150);
        }
        local_f4 = local_f4 + 1;
      }
      for (local_154 = 0; iVar6 = local_154,
          iVar3 = Descriptor::enum_type_count((Descriptor *)in_RSI), iVar6 < iVar3;
          local_154 = local_154 + 1) {
        local_160 = Descriptor::enum_type((Descriptor *)in_RSI,local_154);
        EnumDescriptor::name_abi_cxx11_(local_160);
        local_168._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
                     *)in_stack_fffffffffffffc88,(key_type *)0x4c9604);
        local_170._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
                    *)in_stack_fffffffffffffc88);
        bVar1 = std::operator!=(&local_168,&local_170);
        local_2f9 = false;
        if (bVar1) {
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                                 *)0x4c9664);
          Descriptor::options(ppVar4->second);
          local_2f9 = MessageOptions::map_entry((MessageOptions *)0x4c967e);
        }
        if (local_2f9 != false) {
          in_stack_fffffffffffffcd8 = in_RDX;
          Descriptor::full_name_abi_cxx11_((Descriptor *)in_RSI);
          in_RDX = in_stack_fffffffffffffcd8;
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                                 *)0x4c96c9);
          Descriptor::name_abi_cxx11_(ppVar4->second);
          std::operator+((char *)in_stack_fffffffffffffcd8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          std::operator+(&in_stack_fffffffffffffc98->first,(char *)in_stack_fffffffffffffc90);
          AddError(in_stack_fffffffffffffd80,(string *)in_stack_fffffffffffffd78,
                   (Message *)CONCAT44(iVar2,iVar7),
                   (ErrorLocation)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                   in_stack_fffffffffffffd60);
          std::__cxx11::string::~string(local_190);
          std::__cxx11::string::~string(local_1b0);
        }
      }
      local_1b4 = 0;
      while (iVar6 = local_1b4, iVar3 = Descriptor::oneof_decl_count((Descriptor *)in_RSI),
            iVar6 < iVar3) {
        local_1c0 = Descriptor::oneof_decl((Descriptor *)in_RSI,local_1b4);
        OneofDescriptor::name_abi_cxx11_(local_1c0);
        local_1c8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
                     *)in_stack_fffffffffffffc88,(key_type *)0x4c9839);
        local_1d0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
                    *)in_stack_fffffffffffffc88);
        bVar1 = std::operator!=(&local_1c8,&local_1d0);
        local_349 = false;
        if (bVar1) {
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                                 *)0x4c9893);
          Descriptor::options(ppVar4->second);
          local_349 = MessageOptions::map_entry((MessageOptions *)0x4c98ad);
        }
        if (local_349 != false) {
          in_stack_fffffffffffffc88 = in_RDX;
          __lhs = Descriptor::full_name_abi_cxx11_((Descriptor *)in_RSI);
          in_RDX = in_stack_fffffffffffffc88;
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                                 *)0x4c98f7);
          __rhs = Descriptor::name_abi_cxx11_(ppVar4->second);
          std::operator+((char *)in_stack_fffffffffffffcd8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(iVar3,iVar6));
          std::operator+(__lhs,(char *)__rhs);
          AddError(in_stack_fffffffffffffd80,(string *)in_stack_fffffffffffffd78,
                   (Message *)CONCAT44(iVar2,iVar7),
                   (ErrorLocation)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                   in_stack_fffffffffffffd60);
          std::__cxx11::string::~string(local_1f0);
          std::__cxx11::string::~string(local_210);
        }
        local_1b4 = local_1b4 + 1;
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
              *)0x4c99e9);
      return;
    }
    local_68 = Descriptor::nested_type((Descriptor *)in_RSI,local_4c);
    Descriptor::name_abi_cxx11_(local_68);
    std::make_pair<std::__cxx11::string_const&,google::protobuf::Descriptor_const*&>
              (&in_stack_fffffffffffffc98->first,(Descriptor **)in_stack_fffffffffffffc90);
    _Var5 = std::
            map<std::__cxx11::string,google::protobuf::Descriptor_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>>
            ::insert<std::pair<std::__cxx11::string,google::protobuf::Descriptor_const*>>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
                        *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                       in_stack_fffffffffffffc98);
    local_b0 = (_Base_ptr)_Var5.first._M_node;
    local_a8 = _Var5.second;
    local_78 = local_b0;
    local_70 = local_a8;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>
             *)0x4c90a4);
    if ((local_70 & 1) == 0) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                             *)0x4c90bf);
      Descriptor::options(ppVar4->second);
      bVar1 = MessageOptions::map_entry((MessageOptions *)0x4c90df);
      if (!bVar1) {
        Descriptor::options(local_68);
        bVar1 = MessageOptions::map_entry((MessageOptions *)0x4c9119);
        if (!bVar1) goto LAB_004c927e;
      }
      Descriptor::full_name_abi_cxx11_((Descriptor *)in_RSI);
      Descriptor::name_abi_cxx11_(local_68);
      std::operator+((char *)in_stack_fffffffffffffcd8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
      std::operator+(&in_stack_fffffffffffffc98->first,(char *)in_stack_fffffffffffffc90);
      AddError(in_stack_fffffffffffffd80,(string *)in_stack_fffffffffffffd78,
               (Message *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (ErrorLocation)((ulong)in_stack_fffffffffffffd68 >> 0x20),in_stack_fffffffffffffd60);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_f0);
    }
LAB_004c927e:
    in_stack_fffffffffffffd80 =
         (DescriptorBuilder *)Descriptor::nested_type((Descriptor *)in_RSI,local_4c);
    in_stack_fffffffffffffd78 =
         DescriptorProto::nested_type
                   (in_stack_fffffffffffffc90,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20));
    DetectMapConflicts(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

void DescriptorBuilder::DetectMapConflicts(const Descriptor* message,
                                           const DescriptorProto& proto) {
  std::map<std::string, const Descriptor*> seen_types;
  for (int i = 0; i < message->nested_type_count(); ++i) {
    const Descriptor* nested = message->nested_type(i);
    std::pair<std::map<std::string, const Descriptor*>::iterator, bool> result =
        seen_types.insert(std::make_pair(nested->name(), nested));
    if (!result.second) {
      if (result.first->second->options().map_entry() ||
          nested->options().map_entry()) {
        AddError(message->full_name(), proto,
                 DescriptorPool::ErrorCollector::NAME,
                 "Expanded map entry type " + nested->name() +
                     " conflicts with an existing nested message type.");
      }
    }
    // Recursively test on the nested types.
    DetectMapConflicts(message->nested_type(i), proto.nested_type(i));
  }
  // Check for conflicted field names.
  for (int i = 0; i < message->field_count(); ++i) {
    const FieldDescriptor* field = message->field(i);
    std::map<std::string, const Descriptor*>::iterator iter =
        seen_types.find(field->name());
    if (iter != seen_types.end() && iter->second->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Expanded map entry type " + iter->second->name() +
                   " conflicts with an existing field.");
    }
  }
  // Check for conflicted enum names.
  for (int i = 0; i < message->enum_type_count(); ++i) {
    const EnumDescriptor* enum_desc = message->enum_type(i);
    std::map<std::string, const Descriptor*>::iterator iter =
        seen_types.find(enum_desc->name());
    if (iter != seen_types.end() && iter->second->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Expanded map entry type " + iter->second->name() +
                   " conflicts with an existing enum type.");
    }
  }
  // Check for conflicted oneof names.
  for (int i = 0; i < message->oneof_decl_count(); ++i) {
    const OneofDescriptor* oneof_desc = message->oneof_decl(i);
    std::map<std::string, const Descriptor*>::iterator iter =
        seen_types.find(oneof_desc->name());
    if (iter != seen_types.end() && iter->second->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Expanded map entry type " + iter->second->name() +
                   " conflicts with an existing oneof type.");
    }
  }
}